

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.hpp
# Opt level: O0

void __thiscall
PseudoTopoOrder::PseudoTopoOrder
          (PseudoTopoOrder *this,DiGraph *m,vector<int,_std::allocator<int>_> *ts,
          vector<int,_std::allocator<int>_> *tsi)

{
  vector<int,_std::allocator<int>_> *this_00;
  allocator_type *__a;
  value_type_conflict *__value;
  vector<int,_std::allocator<int>_> *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Chronometer *this_01;
  allocator_type *in_stack_ffffffffffffff78;
  value_type_conflict *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  undefined1 *__n;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffc0,(vector<int,_std::allocator<int>_> *)(in_RDI + 0x18));
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x30);
  std::vector<int,_std::allocator<int>_>::size(in_RDX);
  std::allocator<int>::allocator((allocator<int> *)0x13af07);
  std::vector<int,_std::allocator<int>_>::vector
            (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::allocator<int>::~allocator((allocator<int> *)0x13af2c);
  __a = (allocator_type *)(in_RDI + 0x48);
  __value = (value_type_conflict *)std::vector<int,_std::allocator<int>_>::size(in_RDX);
  __n = &stack0xffffffffffffffc7;
  std::allocator<int>::allocator((allocator<int> *)0x13af63);
  std::vector<int,_std::allocator<int>_>::vector(this_00,(size_type)__n,__value,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x13af88);
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)(in_RDI + 100) = 0;
  *(undefined1 *)(in_RDI + 0x68) = 0;
  this_01 = (Chronometer *)(in_RDI + 0x70);
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  std::vector<NeighborNode,_std::allocator<NeighborNode>_>::vector
            ((vector<NeighborNode,_std::allocator<NeighborNode>_> *)0x13afc2);
  *(undefined8 *)(in_RDI + 0x88) = in_RSI;
  *(undefined4 *)(in_RDI + 0x90) = 0;
  Chronometer::Chronometer(this_01);
  return;
}

Assistant:

PseudoTopoOrder(const DiGraph& m, const std::vector<node_t>& ts, const std::vector<node_t>& tsi) :
		pto(ts),
		pto_inverse(tsi),
		dynamic_programming(ts.size(), 0),
		best_parent(ts.size(),-1),
		best_index(0),
		first_unknown(0),
		path_filled(false),
		m_path(),
		m_parent(m) {}